

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O2

void raster_size(char *fn,int *x,int *y,int *a)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  raster_t hd;
  
  iVar1 = open(fn,0);
  if (iVar1 < 1) {
    iVar1 = 7;
  }
  else {
    sVar2 = read(iVar1,&hd,0x20);
    if (sVar2 == 0x20) {
      *x = hd.width;
      *y = hd.height;
      if (hd.height < *x) {
        hd.height = *x;
      }
      iVar3 = 0x200;
      if (((hd.height - 0x101U < 0x100) || (iVar3 = 0x100, hd.height - 0x81U < 0x80)) ||
         (iVar3 = 0x80, hd.height - 0x41U < 0x40)) {
        *a = iVar3;
        close(iVar1);
        return;
      }
      iVar1 = 0xe;
    }
    else {
      iVar1 = 6;
    }
  }
  error(iVar1);
}

Assistant:

void raster_size(fn,x,y,a)
char *fn ;
int *x, *y, *a ;

{ raster_t hd ;
  int fd, max ;

  if ((fd = open(fn,O_RDONLY)) > 0) {
    if (read(fd,&hd,sizeof(hd)) == sizeof(hd)) {
      *x = hd.width ;
      *y = hd.height ;
      if (*x > *y) {
        max = *x ;
      }
      else {
        max = *y ;
      }
      if (max <= N1 && max > N2) {
        *a = N1 ;
      }
      else if (max <= N2 && max > N3) {
        *a = N2 ;
      }
      else if (max <= N3 && max > N4) {
        *a = N3 ;
      }
      else {
        error(14) ;
      }
    }
    else {
      error(6) ;
    }
  }
  else {
    error(7) ;
  }
  close(fd) ;
}